

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O0

int Mio_CommandPrintGenlib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  FILE *pFile;
  int iVar2;
  FILE *__stream;
  void *pvVar3;
  Mio_Library_t *pLib;
  char *pcVar4;
  int c;
  int fVerbose;
  int fSelected;
  int fShort;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 0;
  c = 0;
  bVar1 = false;
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
LAB_004833d9:
  iVar2 = Extra_UtilGetopt(argc,argv,"savh");
  if (iVar2 == -1) {
    pvVar3 = Abc_FrameReadLibGen();
    pFile = _stdout;
    if (pvVar3 != (void *)0x0) {
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_WriteLibrary(pFile,pLib,0,fVerbose,c);
    }
    else {
      printf("Library is not available.\n");
    }
    pAbc_local._4_4_ = (uint)(pvVar3 == (void *)0x0);
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x61:
    c = c ^ 1;
    goto LAB_004833d9;
  default:
    break;
  case 0x68:
    break;
  case 0x73:
    fVerbose = fVerbose ^ 1;
    goto LAB_004833d9;
  case 0x76:
    goto switchD_00483417_caseD_76;
  }
  fprintf(__stream,"\nusage: print_genlib [-savh]\n");
  fprintf(__stream,"\t          print the current genlib library\n");
  pcVar4 = "no";
  if (fVerbose != 0) {
    pcVar4 = "yes";
  }
  fprintf(__stream,"\t-s      : toggles writing short form [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (c != 0) {
    pcVar4 = "yes";
  }
  fprintf(__stream,"\t-a      : toggles writing min-area gates [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  fprintf(__stream,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar4);
  fprintf(__stream,"\t-h      : print the command usage\n");
  return 1;
switchD_00483417_caseD_76:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_004833d9;
}

Assistant:

int Mio_CommandPrintGenlib( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    int fShort = 0;
    int fSelected = 0;
    int fVerbose = 0;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "savh")) != EOF ) 
    {
        switch (c) 
        {
            case 's':
                fShort ^= 1;
                break;
            case 'a':
                fSelected ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "Library is not available.\n" );
        return 1;
    }
    Mio_WriteLibrary( stdout, (Mio_Library_t *)Abc_FrameReadLibGen(), 0, fShort, fSelected );
    return 0;

usage:
    fprintf( pErr, "\nusage: print_genlib [-savh]\n");
    fprintf( pErr, "\t          print the current genlib library\n" );  
    fprintf( pErr, "\t-s      : toggles writing short form [default = %s]\n", fShort? "yes" : "no" );
    fprintf( pErr, "\t-a      : toggles writing min-area gates [default = %s]\n", fSelected? "yes" : "no" );
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       
}